

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O1

void __thiscall OpenMD::TetrahedralityParamZ::process(TetrahedralityParamZ *this)

{
  int *piVar1;
  double dVar2;
  char cVar3;
  SimInfo *info;
  Snapshot *this_00;
  iterator __position;
  pointer pdVar4;
  double dVar5;
  pointer pOVar6;
  pair<double,_OpenMD::StuntDouble_*> *ppVar7;
  iterator iVar8;
  uint i;
  int iVar9;
  uint uVar10;
  int iVar11;
  StuntDouble *pSVar12;
  StuntDouble *pSVar13;
  ulong uVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  double tmp;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  int isd2;
  int isd1;
  Vector3d rkj;
  Vector3d rik;
  Vector3d rk;
  Vector3d vec;
  Vector3d rj;
  Vector3d ri;
  Mat3x3d hmat;
  DumpReader reader;
  SelectionSet local_1468;
  pair<double,_OpenMD::StuntDouble_*> *local_1448;
  iterator iStack_1440;
  pair<double,_OpenMD::StuntDouble_*> *local_1438;
  int local_1424;
  double local_1420;
  int local_1414;
  int local_1410;
  int local_140c;
  Vector3d local_1408;
  Vector3d local_13e8;
  SelectionManager *local_13c8;
  SelectionManager *local_13c0;
  Vector3d local_13b8;
  Vector3d local_1398;
  vector<double,std::allocator<double>> *local_1380;
  SelectionEvaluator *local_1378;
  SelectionEvaluator *local_1370;
  ulong local_1368;
  double local_1360;
  ulong local_1358;
  double local_1350;
  double local_1348 [4];
  double local_1328 [4];
  double local_1308 [4];
  double local_12e8 [3];
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  local_1398.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1398.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1328[2] = 0.0;
  local_1328[0] = 0.0;
  local_1328[1] = 0.0;
  local_1348[2] = 0.0;
  local_1348[0] = 0.0;
  local_1348[1] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13b8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_13e8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_13e8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_13e8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1408.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1408.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1408.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1438 = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  local_1448 = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  iStack_1440._M_current = (pair<double,_OpenMD::StuntDouble_*> *)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar3 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar9 = DumpReader::getNFrames(&local_1288);
  if (0 < iVar9) {
    local_1380 = (vector<double,std::allocator<double>> *)&this->zBox_;
    local_1370 = &this->evaluator1_;
    local_1378 = &this->evaluator2_;
    local_13c8 = &this->seleMan1_;
    local_13c0 = &this->seleMan2_;
    uVar14 = 0;
    local_1414 = iVar9;
    do {
      local_1368 = uVar14;
      DumpReader::readFrame(&local_1288,(int)uVar14);
      this_00 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_00;
      Snapshot::getHmat(&local_12d0,this_00);
      pdVar15 = (double *)
                ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)(uint)this->axis_ * 0x20);
      __position._M_current =
           (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_1380,__position,pdVar15);
      }
      else {
        *__position._M_current = *pdVar15;
        (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1360 = *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis_ * 0x20) * 0.5;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1468,local_1370);
        lVar19 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar19),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1468.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar19));
          lVar19 = lVar19 + 0x28;
        } while (lVar19 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1468.bitsets_);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1468,local_1378);
        lVar19 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar19),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1468.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar19));
          lVar19 = lVar19 + 0x28;
        } while (lVar19 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1468.bitsets_);
      }
      pSVar12 = SelectionManager::beginSelected(local_13c8,&local_140c);
      while (pSVar12 != (StuntDouble *)0x0) {
        if (iStack_1440._M_current != local_1448) {
          iStack_1440._M_current = local_1448;
        }
        iVar9 = pSVar12->globalIndex_;
        pSVar13 = SelectionManager::beginSelected(local_13c0,&local_1410);
        while (iVar8._M_current = iStack_1440._M_current, ppVar7 = local_1448,
              pSVar13 != (StuntDouble *)0x0) {
          if (pSVar13->globalIndex_ != iVar9) {
            lVar19 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_)
            ;
            local_12e8[2] =
                 (double)*(undefined8 *)(lVar19 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
            pdVar15 = (double *)(lVar19 + (long)pSVar12->localIndex_ * 0x18);
            local_12e8[0] = *pdVar15;
            local_12e8[1] = pdVar15[1];
            lVar19 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_)
            ;
            local_1308[2] =
                 (double)*(undefined8 *)(lVar19 + 0x10 + (long)pSVar13->localIndex_ * 0x18);
            pdVar15 = (double *)(lVar19 + (long)pSVar13->localIndex_ * 0x18);
            local_1308[0] = *pdVar15;
            local_1308[1] = pdVar15[1];
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar19 = 0;
            do {
              (&local_1468.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                   (pointer)(local_12e8[lVar19] - local_1308[lVar19]);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_1398.super_Vector<double,_3U>.data_[2] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1398.super_Vector<double,_3U>.data_[0] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_1398.super_Vector<double,_3U>.data_[1] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar3 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_1398);
            }
            dVar5 = 0.0;
            lVar19 = 0;
            do {
              dVar2 = local_1398.super_Vector<double,_3U>.data_[lVar19];
              dVar5 = dVar5 + dVar2 * dVar2;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (dVar5 < 0.0) {
              pOVar6 = (pointer)sqrt(dVar5);
            }
            else {
              pOVar6 = (pointer)SQRT(dVar5);
            }
            if ((double)pOVar6 < this->rCut_) {
              local_1468.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = pOVar6;
              local_1468.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar13;
              if (iStack_1440._M_current == local_1438) {
                std::
                vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                ::_M_realloc_insert<std::pair<double,OpenMD::StuntDouble*>>
                          ((vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                            *)&local_1448,iStack_1440,
                           (pair<double,_OpenMD::StuntDouble_*> *)&local_1468);
              }
              else {
                (iStack_1440._M_current)->first = (double)pOVar6;
                (iStack_1440._M_current)->second = pSVar13;
                iStack_1440._M_current = iStack_1440._M_current + 1;
              }
            }
          }
          pSVar13 = SelectionManager::nextSelected(local_13c0,&local_1410);
        }
        if (local_1448 != iStack_1440._M_current) {
          uVar14 = (long)iStack_1440._M_current - (long)local_1448 >> 4;
          lVar19 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_1448,iStack_1440._M_current,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (ppVar7,iVar8._M_current);
        }
        uVar16 = (long)iStack_1440._M_current - (long)local_1448 >> 4;
        uVar14 = 4;
        if (uVar16 < 4) {
          uVar14 = uVar16;
        }
        uVar10 = (int)uVar14 - 1;
        lVar19 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
        pdVar15 = (double *)(lVar19 + (long)pSVar12->localIndex_ * 0x18);
        local_13b8.super_Vector<double,_3U>.data_[0] = *pdVar15;
        local_13b8.super_Vector<double,_3U>.data_[1] = pdVar15[1];
        local_13b8.super_Vector<double,_3U>.data_[2] =
             *(double *)(lVar19 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
        local_1424 = (int)((double)(int)(uVar10 * (int)uVar14) * 0.5);
        local_1420 = 1.0;
        if (1 < uVar16) {
          local_1350 = (double)local_1424;
          local_1358 = (ulong)uVar10;
          uVar18 = 1;
          uVar16 = 0;
          local_1420 = 1.0;
          do {
            pSVar12 = local_1448[uVar16].second;
            lVar19 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_)
            ;
            pdVar15 = (double *)(lVar19 + (long)pSVar12->localIndex_ * 0x18);
            local_1328[0] = *pdVar15;
            local_1328[1] = pdVar15[1];
            local_1328[2] =
                 (double)*(undefined8 *)(lVar19 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1468.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            lVar19 = 0;
            do {
              (&local_1468.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                   (pointer)(local_13b8.super_Vector<double,_3U>.data_[lVar19] - local_1328[lVar19])
              ;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_13e8.super_Vector<double,_3U>.data_[2] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_13e8.super_Vector<double,_3U>.data_[0] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_13e8.super_Vector<double,_3U>.data_[1] =
                 (double)local_1468.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            if (cVar3 != '\0') {
              Snapshot::wrapVector(this->currentSnapshot_,&local_13e8);
            }
            dVar5 = 0.0;
            lVar19 = 0;
            do {
              dVar2 = local_13e8.super_Vector<double,_3U>.data_[lVar19];
              dVar5 = dVar5 + dVar2 * dVar2;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if (dVar5 < 0.0) {
              dVar5 = sqrt(dVar5);
            }
            else {
              dVar5 = SQRT(dVar5);
            }
            lVar19 = 0;
            do {
              local_13e8.super_Vector<double,_3U>.data_[lVar19] =
                   local_13e8.super_Vector<double,_3U>.data_[lVar19] / dVar5;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            uVar16 = uVar16 + 1;
            uVar17 = uVar18;
            if (uVar16 < uVar14) {
              do {
                pSVar12 = local_1448[uVar17].second;
                lVar19 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).
                                          position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar12->storage_);
                pdVar15 = (double *)(lVar19 + (long)pSVar12->localIndex_ * 0x18);
                local_1348[0] = *pdVar15;
                local_1348[1] = pdVar15[1];
                local_1348[2] =
                     (double)*(undefined8 *)(lVar19 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
                local_1468.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1468.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1468.bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                lVar19 = 0;
                do {
                  (&local_1468.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_start)[lVar19] =
                       (pointer)(local_13b8.super_Vector<double,_3U>.data_[lVar19] -
                                local_1348[lVar19]);
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_1408.super_Vector<double,_3U>.data_[2] =
                     (double)local_1468.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_1408.super_Vector<double,_3U>.data_[0] =
                     (double)local_1468.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                local_1408.super_Vector<double,_3U>.data_[1] =
                     (double)local_1468.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                if (cVar3 != '\0') {
                  Snapshot::wrapVector(this->currentSnapshot_,&local_1408);
                }
                dVar5 = 0.0;
                lVar19 = 0;
                do {
                  dVar2 = local_1408.super_Vector<double,_3U>.data_[lVar19];
                  dVar5 = dVar5 + dVar2 * dVar2;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                if (dVar5 < 0.0) {
                  dVar5 = sqrt(dVar5);
                }
                else {
                  dVar5 = SQRT(dVar5);
                }
                lVar19 = 0;
                do {
                  local_1408.super_Vector<double,_3U>.data_[lVar19] =
                       local_1408.super_Vector<double,_3U>.data_[lVar19] / dVar5;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                dVar5 = 0.0;
                lVar19 = 0;
                do {
                  dVar5 = dVar5 + local_13e8.super_Vector<double,_3U>.data_[lVar19] *
                                  local_1408.super_Vector<double,_3U>.data_[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar19 != 3);
                local_1420 = local_1420 +
                             ((dVar5 + 0.3333333333333333) * (dVar5 + 0.3333333333333333) * -2.25) /
                             local_1350;
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar14);
            }
            uVar18 = uVar18 + 1;
          } while (uVar16 != local_1358);
        }
        iVar9 = local_1414;
        if (0 < local_1424) {
          if (cVar3 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&local_13b8);
          }
          iVar11 = (int)(((local_13b8.super_Vector<double,_3U>.data_[(uint)this->axis_] + local_1360
                          ) * (double)(this->super_StaticAnalyser).nBins_) /
                        *(double *)
                         ((long)local_12d0.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
          pdVar4 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[iVar11] = pdVar4[iVar11] + local_1420;
          pdVar4 = (this->sliceQ2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[iVar11] = local_1420 * local_1420 + pdVar4[iVar11];
          piVar1 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar11;
          *piVar1 = *piVar1 + 1;
        }
        pSVar12 = SelectionManager::nextSelected(local_13c8,&local_140c);
      }
      uVar10 = (int)local_1368 + (this->super_StaticAnalyser).step_;
      uVar14 = (ulong)uVar10;
    } while ((int)uVar10 < iVar9);
  }
  writeQz(this);
  DumpReader::~DumpReader(&local_1288);
  if (local_1448 != (pair<double,_OpenMD::StuntDouble_*> *)0x0) {
    operator_delete(local_1448,(long)local_1438 - (long)local_1448);
  }
  return;
}

Assistant:

void TetrahedralityParamZ::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) { myNeighbors.push_back(std::make_pair(r, sd2)); }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));

        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
          }
        }

        if (nang > 0) {
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rk);

          int binNo =
              int(nBins_ * (halfBoxZ_ + rk[axis_]) / hmat(axis_, axis_));
          sliceQ_[binNo] += Qk;
          sliceQ2_[binNo] += Qk * Qk;
          sliceCount_[binNo] += 1;
        }
      }
    }
    writeQz();
  }